

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O2

ptr<Value> __thiscall
PrimitiveExpression<String>::evaluate(PrimitiveExpression<String> *this,Environment *env)

{
  _Alloc_hider _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  Member local_18;
  _Alloc_hider _Stack_10;
  
  std::make_shared<String,String&>((String *)&stack0xffffffffffffffe8);
  _Var1._M_p = _Stack_10._M_p;
  _Stack_10._M_p = (pointer)0x0;
  (this->super_Expression)._vptr_Expression = local_18._vptr_Member;
  (this->value).super_Value.super_Member._vptr_Member = (_func_int **)_Var1._M_p;
  local_18._vptr_Member = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }